

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall QRenderRule::contentsRect(QRenderRule *this,QRect *r)

{
  long lVar1;
  bool bVar2;
  QRenderRule *in_RSI;
  long in_FS_OFFSET;
  QRect QVar3;
  int *p;
  QRect pr;
  QRenderRule *in_stack_ffffffffffffffb0;
  QRect *in_stack_ffffffffffffffc0;
  QRect *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = paddingRect(in_RSI,in_stack_ffffffffffffffc0);
  bVar2 = hasBox(in_stack_ffffffffffffffb0);
  if (bVar2) {
    box((QRenderRule *)0x420114);
    QVar3 = QRect::adjusted(in_stack_ffffffffffffffe8,QVar3.y2.m_i.m_i,QVar3.x2.m_i.m_i,
                            QVar3.y1.m_i.m_i,QVar3.x1.m_i.m_i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar3;
}

Assistant:

QRect QRenderRule::contentsRect(const QRect& r) const
{
    QRect pr = paddingRect(r);
    if (!hasBox())
        return pr;
    const int *p = box()->paddings;
    return pr.adjusted(p[LeftEdge], p[TopEdge], -p[RightEdge], -p[BottomEdge]);
}